

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::var_decl(analysis *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar4;
  NodePtr tmp_ptr;
  int local_c4;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  token::getVal_abi_cxx11_
            ((string *)&tmp_ptr,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_c4 = token::getLineno((in_RSI->tmp).
                              super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::make_shared<dh::TreeNode,std::__cxx11::string,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (int *)&tmp_ptr);
  std::__cxx11::string::~string((string *)&tmp_ptr);
  token::getVal_abi_cxx11_
            ((string *)&tmp_ptr,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &tmp_ptr,"int");
  std::__cxx11::string::~string((string *)&tmp_ptr);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_40,"int",(allocator *)&tmp_ptr);
    match(in_RSI,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 2;
    TreeNode::setType(*(TreeNode **)this,(int *)&tmp_ptr);
  }
  else {
    token::getVal_abi_cxx11_
              ((string *)&tmp_ptr,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &tmp_ptr,"boolean");
    std::__cxx11::string::~string((string *)&tmp_ptr);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_60,"boolean",(allocator *)&tmp_ptr);
      match(in_RSI,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      TreeNode::setType(*(TreeNode **)this,(int *)&tmp_ptr);
    }
    else {
      token::getVal_abi_cxx11_
                ((string *)&tmp_ptr,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tmp_ptr,"float");
      std::__cxx11::string::~string((string *)&tmp_ptr);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_80,"float",(allocator *)&tmp_ptr);
        match(in_RSI,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 3;
        TreeNode::setType(*(TreeNode **)this,(int *)&tmp_ptr);
      }
      else {
        token::getVal_abi_cxx11_
                  ((string *)&tmp_ptr,
                   (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&tmp_ptr,"void");
        std::__cxx11::string::~string((string *)&tmp_ptr);
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] Unexpected type \"");
          token::getVal_abi_cxx11_
                    ((string *)&tmp_ptr,
                     (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          poVar3 = std::operator<<(poVar3,(string *)&tmp_ptr);
          poVar3 = std::operator<<(poVar3,"\" in line ");
          iVar2 = token::getLineno((in_RSI->tmp).
                                   super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&tmp_ptr);
          exit(1);
        }
        std::__cxx11::string::string((string *)&local_a0,"void",(allocator *)&tmp_ptr);
        match(in_RSI,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 4;
        TreeNode::setType(*(TreeNode **)this,(int *)&tmp_ptr);
      }
    }
  }
  tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)&tmp_ptr);
  tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 1;
  TreeNode::setKind(*(TreeNode **)this,(int *)&tmp_ptr);
  init_declarator_list((analysis *)&tmp_ptr);
  TreeNode::appendChild(*(TreeNode **)this,&tmp_ptr);
  std::__cxx11::string::string((string *)&local_c0,";",(allocator *)&local_c4);
  match(in_RSI,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tmp_ptr.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::var_decl()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in var_decl\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>(tmp->getVal(), tmp->getLineno());
	if ( tmp->getVal() == "int")
	{
		match("int");
		ret->setType(TypeKind::IntK);
	} else if ( tmp->getVal() == "boolean")
	{
		match("boolean");
		ret->setType(TypeKind::BoolK);
	} else if ( tmp->getVal() == "float")
	{
		match("float");
		ret->setType(TypeKind::FloatK);
	} else if ( tmp->getVal() == "void")
	{
		match("void");
		ret->setType(TypeKind::VoidK);
	} else 
	{
		::std::cerr << "[ERROR] Unexpected type \""
			<< tmp->getVal()
			<< "\" in line "
			<< tmp->getLineno()
			<< ::std::endl;
		::std::exit(1);
	}
	ret->setNodeKind(NodeKind::DeclK);
	ret->setKind(DeclKind::VarK);

	NodePtr tmp_ptr = init_declarator_list();
	ret->appendChild(tmp_ptr);

	match(";");

	return ret;
}